

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::SetWarningFromPreset(cmake *this,string *name,optional<bool> *warning,optional<bool> *error)

{
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type mVar3;
  
  if ((warning->super__Optional_base<bool,_true,_true>)._M_payload.
      super__Optional_payload_base<bool>._M_engaged == true) {
    bVar1 = (warning->super__Optional_base<bool,_true,_true>)._M_payload.
            super__Optional_payload_base<bool>._M_payload._M_value;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](&this->DiagLevels,name);
    if (bVar1 == true) {
      mVar3 = DIAG_WARN;
      if (1 < (int)*pmVar2) {
        mVar3 = *pmVar2;
      }
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
               ::operator[](&this->DiagLevels,name);
      *pmVar2 = mVar3;
    }
    else {
      *pmVar2 = DIAG_IGNORE;
    }
  }
  if ((error->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged == true) {
    bVar1 = (error->super__Optional_base<bool,_true,_true>)._M_payload.
            super__Optional_payload_base<bool>._M_payload._M_value;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](&this->DiagLevels,name);
    if (bVar1 == true) {
      *pmVar2 = DIAG_ERROR;
    }
    else {
      mVar3 = DIAG_WARN;
      if ((int)*pmVar2 < 1) {
        mVar3 = *pmVar2;
      }
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
               ::operator[](&this->DiagLevels,name);
      *pmVar2 = mVar3;
    }
  }
  return;
}

Assistant:

void cmake::SetWarningFromPreset(const std::string& name,
                                 const cm::optional<bool>& warning,
                                 const cm::optional<bool>& error)
{
  if (warning) {
    if (*warning) {
      this->DiagLevels[name] = std::max(this->DiagLevels[name], DIAG_WARN);
    } else {
      this->DiagLevels[name] = DIAG_IGNORE;
    }
  }
  if (error) {
    if (*error) {
      this->DiagLevels[name] = DIAG_ERROR;
    } else {
      this->DiagLevels[name] = std::min(this->DiagLevels[name], DIAG_WARN);
    }
  }
}